

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3-write.c
# Opt level: O0

int mp3_fill_si(mp3_frame_t *frame)

{
  bool bVar1;
  uint uVar2;
  mp3_si_t *pmVar3;
  uint uVar4;
  bool bVar5;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint j_1;
  uint j;
  mp3_granule_t *gr;
  uint gri;
  uint band;
  int ngr;
  uint i;
  int private_bitlen;
  uint nch;
  mp3_si_t *si;
  bv_t bv;
  uchar *ptr;
  int is_lsf;
  mp3_frame_t *frame_local;
  
  if (frame != (mp3_frame_t *)0x0) {
    bVar5 = frame->id != '\x03';
    bv._8_8_ = frame->raw + 4;
    if (frame->protected == '\0') {
      bv._8_8_ = frame->raw + 6;
    }
    bv_init((bv_t *)&si,(uchar *)bv._8_8_,(uint)frame->si_bitsize);
    pmVar3 = &frame->si;
    uVar2 = 1;
    if (frame->mode != '\x03') {
      uVar2 = 2;
    }
    uVar4 = 9;
    if (bVar5) {
      uVar4 = 8;
    }
    bv_put_bits((bv_t *)&si,(ulong)pmVar3->main_data_end,uVar4);
    if (bVar5) {
      local_64 = 2;
      if (uVar2 == 1) {
        local_64 = 1;
      }
    }
    else {
      local_64 = 3;
      if (uVar2 == 1) {
        local_64 = 5;
      }
    }
    bv_put_bits((bv_t *)&si,(ulong)(frame->si).private_bits,local_64);
    if (!bVar5) {
      for (band = 0; band < uVar2; band = band + 1) {
        for (gr._4_4_ = 0; gr._4_4_ < 4; gr._4_4_ = gr._4_4_ + 1) {
          bv_put_bits((bv_t *)&si,(ulong)(frame->si).channel[band].scfsi[gr._4_4_],1);
        }
      }
    }
    bVar1 = false;
    while (!bVar1) {
      for (band = 0; band < uVar2; band = band + 1) {
        bv_put_bits((bv_t *)&si,(long)pmVar3->channel[band].granule[0].part2_3_length,0xc);
        bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].big_values,9);
        bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].global_gain,8);
        uVar4 = 4;
        if (bVar5) {
          uVar4 = 9;
        }
        bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].scale_comp,uVar4);
        bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].blocksplit_flag,1);
        if (pmVar3->channel[band].granule[0].blocksplit_flag == 0) {
          for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
            bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].tbl_sel[local_60],5);
          }
          bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].reg0_cnt,4);
          bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].reg1_cnt,3);
        }
        else {
          bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].block_type,2);
          bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].switch_point,1);
          bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].tbl_sel[0],5);
          bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].tbl_sel[1],5);
          for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
            bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].sub_gain[local_5c],3);
          }
        }
        if (!bVar5) {
          bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].preflag,1);
        }
        bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].scale_scale,1);
        bv_put_bits((bv_t *)&si,(ulong)pmVar3->channel[band].granule[0].cnt1tbl_sel,1);
      }
      bVar1 = true;
    }
    return 1;
  }
  __assert_fail("frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-write.c",0x18,
                "int mp3_fill_si(mp3_frame_t *)");
}

Assistant:

int mp3_fill_si(mp3_frame_t *frame) {
  assert(frame != NULL);
  assert((frame->si_bitsize != 0) ||
         "Trying to write an empty sideinfo");

  const int is_lsf = frame->id != MPEG_VERSION_1; // MPEG 2 and 2.5 are Lower Sampling Frequency extension

  unsigned char *ptr = frame->raw + 4;
  if (frame->protected == 0)
    ptr += 2;

  bv_t bv;
  bv_init(&bv, ptr, frame->si_bitsize);

  mp3_si_t *si = &frame->si;
  unsigned int nch = (frame->mode != 3) ? 2 : 1;

  bv_put_bits(&bv, si->main_data_end, is_lsf ? 8 : 9);
  const int private_bitlen = is_lsf ? ((nch == 1) ? 1 : 2) :
                             ((nch == 1) ? 5 : 3);
  bv_put_bits(&bv, si->private_bits, private_bitlen);

  unsigned int i;
  int ngr = 1;

  if (!is_lsf) {
    for (i = 0; i < nch; i++) {
      unsigned int band;
      for (band = 0; band < 4; band++)
        bv_put_bits(&bv, si->channel[i].scfsi[band], 1);
    }
  }

  unsigned int gri;
  for (gri = 0; gri < ngr; gri++) {
    for (i = 0; i < nch; i++) {
      mp3_granule_t *gr = &si->channel[i].granule[gri];

      bv_put_bits(&bv, gr->part2_3_length, 12);
      bv_put_bits(&bv, gr->big_values, 9);
      bv_put_bits(&bv, gr->global_gain, 8);
      bv_put_bits(&bv, gr->scale_comp, is_lsf ? 9 : 4);
      bv_put_bits(&bv, gr->blocksplit_flag, 1);

      if (gr->blocksplit_flag) {
        bv_put_bits(&bv, gr->block_type, 2);
        bv_put_bits(&bv, gr->switch_point, 1);
        bv_put_bits(&bv, gr->tbl_sel[0], 5);
        bv_put_bits(&bv, gr->tbl_sel[1], 5);

        unsigned int j;
        for (j = 0; j < 3; j++)
          bv_put_bits(&bv, gr->sub_gain[j], 3);
      } else {
        unsigned int j;
        for (j = 0; j < 3; j++)
          bv_put_bits(&bv, gr->tbl_sel[j], 5);

        bv_put_bits(&bv, gr->reg0_cnt, 4);
        bv_put_bits(&bv, gr->reg1_cnt, 3);
      }

      if (!is_lsf) {
        bv_put_bits(&bv, gr->preflag, 1);
      }
      bv_put_bits(&bv, gr->scale_scale, 1);
      bv_put_bits(&bv, gr->cnt1tbl_sel, 1);
    }
  }

  assert((bv.len == bv.idx) || "Bitvector is not filled completely");

  return 1;
}